

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd.cc
# Opt level: O0

int RIPEMD160_Final(uchar *md,RIPEMD160_CTX *c)

{
  RIPEMD160_CTX *c_local;
  uint8_t *out_local;
  
  crypto_md32_final(ripemd160_block_data_order,&c->A,(uint8_t *)c->data,0x40,&c->num,c->Nh,c->Nl,0);
  CRYPTO_store_u32_le(md,c->A);
  CRYPTO_store_u32_le(md + 4,c->B);
  CRYPTO_store_u32_le(md + 8,c->C);
  CRYPTO_store_u32_le(md + 0xc,c->D);
  CRYPTO_store_u32_le(md + 0x10,c->E);
  return 1;
}

Assistant:

int RIPEMD160_Final(uint8_t out[RIPEMD160_DIGEST_LENGTH], RIPEMD160_CTX *c) {
  crypto_md32_final(&ripemd160_block_data_order, c->h, c->data,
                    RIPEMD160_CBLOCK, &c->num, c->Nh, c->Nl,
                    /*is_big_endian=*/0);

  CRYPTO_store_u32_le(out, c->h[0]);
  CRYPTO_store_u32_le(out + 4, c->h[1]);
  CRYPTO_store_u32_le(out + 8, c->h[2]);
  CRYPTO_store_u32_le(out + 12, c->h[3]);
  CRYPTO_store_u32_le(out + 16, c->h[4]);
  return 1;
}